

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

void qpdf_oh_set_array_item(qpdf_data qpdf,qpdf_oh oh,int at,qpdf_oh item)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  local_28._12_4_ = item;
  local_28._8_4_ = at;
  pcStack_10 = std::
               _Function_handler<void_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1600:31)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1600:31)>
             ::_M_manager;
  local_28._M_unused._M_object = qpdf;
  do_with_oh_void(qpdf,oh,(function<void_(QPDFObjectHandle_&)> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void
qpdf_oh_set_array_item(qpdf_data qpdf, qpdf_oh oh, int at, qpdf_oh item)
{
    do_with_oh_void(qpdf, oh, [qpdf, at, item](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_set_array_item");
        o.setArrayItem(at, qpdf_oh_item_internal(qpdf, item));
    });
}